

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int m_id(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  internal_state_conflict *piVar2;
  byte bVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  
  piVar1 = strm->state;
  iVar5 = 0;
  if (piVar1->rsip == piVar1->rsi_buffer) {
    if ((strm->flags & 0x20) != 0) {
      piVar1->bitp = piVar1->bitp - piVar1->bitp % 8;
    }
    if (piVar1->pp == 0) goto LAB_00103329;
    iVar5 = 1;
  }
  piVar1->ref = iVar5;
LAB_00103329:
  uVar4 = bits_ask(strm,piVar1->id_len);
  if (uVar4 != 0) {
    piVar2 = strm->state;
    iVar5 = piVar2->bitp - piVar1->id_len;
    bVar3 = -(char)piVar1->id_len;
    iVar6 = (int)(((piVar2->acc >> ((byte)iVar5 & 0x3f)) << (bVar3 & 0x3f)) >> (bVar3 & 0x3f));
    piVar1->id = iVar6;
    piVar2->bitp = iVar5;
    piVar1->mode = piVar1->id_table[iVar6];
  }
  return (uint)(uVar4 != 0);
}

Assistant:

static int m_id(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (state->rsip == state->rsi_buffer) {
        if(strm->flags & AEC_PAD_RSI)
            state->bitp -= state->bitp % 8;
        if (state->pp)
            state->ref = 1;
    } else {
        state->ref = 0;
    }
    if (bits_ask(strm, state->id_len) == 0)
        return M_EXIT;
    state->id = bits_get(strm, state->id_len);
    bits_drop(strm, state->id_len);
    state->mode = state->id_table[state->id];

    return M_CONTINUE;
}